

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.h
# Opt level: O2

void __thiscall
ZXing::ImageView::ImageView
          (ImageView *this,uint8_t *data,int width,int height,ImageFormat format,int rowStride,
          int pixStride)

{
  uint uVar1;
  invalid_argument *this_00;
  int iVar2;
  
  this->_data = data;
  this->_format = format;
  this->_width = width;
  uVar1 = format >> 0x18;
  if (pixStride != 0) {
    uVar1 = pixStride;
  }
  this->_height = height;
  this->_pixStride = uVar1;
  iVar2 = uVar1 * width;
  if (rowStride != 0) {
    iVar2 = rowStride;
  }
  this->_rowStride = iVar2;
  if (width == 0 && data == (uint8_t *)0x0) {
    if ((rowStride == 0 && height == 0) && pixStride == 0) {
      fwrite("zxing-cpp deprecation warning: ImageView(nullptr, ...) will throw in the future, use ImageView()\n"
             ,0x61,1,_stderr);
      return;
    }
  }
  else if (data != (uint8_t *)0x0) {
    if ((0 < width) && (0 < height)) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Neither width nor height of ImageView can be less or equal to 0");
    goto LAB_00152e3e;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"Can not construct an ImageView from a NULL pointer");
LAB_00152e3e:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ImageView(const uint8_t* data, int width, int height, ImageFormat format, int rowStride = 0, int pixStride = 0)
		: _data(data),
		  _format(format),
		  _width(width),
		  _height(height),
		  _pixStride(pixStride ? pixStride : PixStride(format)),
		  _rowStride(rowStride ? rowStride : width * _pixStride)
	{
		// TODO: [[deprecated]] this check is to prevent exising code from suddenly throwing, remove in 3.0
		if (_data == nullptr && _width == 0 && _height == 0 && rowStride == 0 && pixStride == 0) {
			fprintf(stderr, "zxing-cpp deprecation warning: ImageView(nullptr, ...) will throw in the future, use ImageView()\n");
			return;
		}

		if (_data == nullptr)
			throw std::invalid_argument("Can not construct an ImageView from a NULL pointer");

		if (_width <= 0 || _height <= 0)
			throw std::invalid_argument("Neither width nor height of ImageView can be less or equal to 0");
	}